

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_splice_node_Test::TestBody(IntrusiveListTest_splice_node_Test *this)

{
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_03;
  vector<int,_std::allocator<int>_> *expected_04;
  int __fdin;
  iterator iVar1;
  iterator __x;
  TestObjectList list4;
  TestObjectList local_c8;
  TestObjectList list3;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  TestObjectList list2;
  TestObjectList list1;
  
  list3.first_ = (TestObject *)0x200000001;
  list3.last_ = (TestObject *)CONCAT44(list3.last_._4_4_,3);
  list2.first_ = (TestObject *)0x0;
  list2.last_ = (TestObject *)0x0;
  list2.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list2,&list3);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&list1,(IntrusiveListTest *)&list2,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list2);
  list4.first_ = (TestObject *)0xc800000064;
  list3.first_ = (TestObject *)0x0;
  list3.last_ = (TestObject *)0x0;
  list3.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list3,&list4);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&list2,(IntrusiveListTest *)&list3,data_values_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list3);
  __fdin = (int)&list1;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,__fdin,(__off64_t *)list1.first_,(int)&list2,(__off64_t *)&list2,
             (size_t)list2.first_,(uint)list4.first_);
  list4.first_ = (TestObject *)0x100000064;
  list4.last_ = (TestObject *)0x300000002;
  list3.first_ = (TestObject *)0x0;
  list3.last_ = (TestObject *)0x0;
  list3.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list3,&list4,&list4.size_);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&list3,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list3);
  list4.first_ = (TestObject *)CONCAT44(list4.first_._4_4_,200);
  list3.first_ = (TestObject *)0x0;
  list3.last_ = (TestObject *)0x0;
  list3.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list3,&list4,
             (undefined1 *)((long)&list4.first_ + 4));
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list2,&list3,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list3);
  local_c8.first_ = (TestObject *)0x258000001f4;
  local_c8.last_ = (TestObject *)CONCAT44(local_c8.last_._4_4_,700);
  list4.first_ = (TestObject *)0x0;
  list4.last_ = (TestObject *)0x0;
  list4.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list4,&local_c8);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&list3,(IntrusiveListTest *)&list4,data_values_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list4);
  iVar1.node_ = list3.first_;
  iVar1.list_ = &list3;
  iVar1 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(iVar1,2);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,__fdin,(__off64_t *)0x0,(int)&list3,(__off64_t *)iVar1.list_,(size_t)iVar1.node_
             ,(uint)list4.first_);
  local_c8.first_ = (TestObject *)0x100000064;
  local_c8.last_ = (TestObject *)0x300000002;
  local_c8.size_ = CONCAT44(local_c8.size_._4_4_,700);
  list4.first_ = (TestObject *)0x0;
  list4.last_ = (TestObject *)0x0;
  list4.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list4,&local_c8,
             (undefined1 *)((long)&local_c8.size_ + 4));
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&list4,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list4);
  local_c8.first_ = (TestObject *)0x258000001f4;
  list4.first_ = (TestObject *)0x0;
  list4.last_ = (TestObject *)0x0;
  list4.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list4,&local_c8,&local_c8.last_);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list3,&list4,expected_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list4);
  local_88 = CONCAT44(local_88._4_4_,400);
  local_c8.first_ = (TestObject *)0x0;
  local_c8.last_ = (TestObject *)0x0;
  local_c8.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_c8,&local_88);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&list4,(IntrusiveListTest *)&local_c8,data_values_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c8);
  __x.node_ = list1.first_;
  __x.list_ = &list1;
  iVar1 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x,3);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,(int)iVar1.list_,(__off64_t *)iVar1.node_,(int)&list4,(__off64_t *)&list4,
             (size_t)list4.first_,(uint)list4.first_);
  local_88 = 0x100000064;
  uStack_80 = 0x19000000002;
  local_78 = 0x2bc00000003;
  local_c8.first_ = (TestObject *)0x0;
  local_c8.last_ = (TestObject *)0x0;
  local_c8.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_c8,&local_88,local_70);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_c8,expected_03);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c8);
  local_c8.first_ = (TestObject *)0x0;
  local_c8.last_ = (TestObject *)0x0;
  local_c8.size_ = 0;
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list4,&local_c8,expected_04);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_c8);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list4);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list3);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list2);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list1);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_node) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200});
  list1.splice(list1.begin(), list2, list2.begin());
  AssertListEq(list1, {100, 1, 2, 3});
  AssertListEq(list2, {200});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin(), 2));
  AssertListEq(list1, {100, 1, 2, 3, 700});
  AssertListEq(list3, {500, 600});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 3), list4, list4.begin());
  AssertListEq(list1, {100, 1, 2, 400, 3, 700});
  AssertListEq(list4, {});
}